

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Status __thiscall
google::protobuf::compiler::cpp::CppGenerator::ValidateFeatures
          (CppGenerator *this,FileDescriptor *file)

{
  FileDescriptor *in_RDX;
  FileDescriptor *file_local;
  CppGenerator *this_local;
  Status *status;
  
  absl::lts_20250127::OkStatus();
  protobuf::internal::
  VisitDescriptors<google::protobuf::compiler::cpp::CppGenerator::ValidateFeatures(google::protobuf::FileDescriptor_const*)const::__0>
            (in_RDX,(anon_class_8_1_6bf1c130)this);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status CppGenerator::ValidateFeatures(const FileDescriptor* file) const {
  absl::Status status = absl::OkStatus();
  google::protobuf::internal::VisitDescriptors(*file, [&](const FieldDescriptor& field) {
    const FeatureSet& resolved_features = GetResolvedSourceFeatures(field);
    const pb::CppFeatures& unresolved_features =
        GetUnresolvedSourceFeatures(field, pb::cpp);
    if (field.enum_type() != nullptr &&
        resolved_features.GetExtension(::pb::cpp).legacy_closed_enum() &&
        resolved_features.field_presence() == FeatureSet::IMPLICIT) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Field ", field.full_name(),
                       " has a closed enum type with implicit presence."));
    }

    if (field.containing_type() == nullptr ||
        !field.containing_type()->options().map_entry()) {
      // Skip validation of explicit features on generated map fields.  These
      // will be blindly propagated from the original map field, and may violate
      // a lot of these conditions.  Note: we do still validate the
      // user-specified map field.
      if (unresolved_features.has_legacy_closed_enum() &&
          field.cpp_type() != FieldDescriptor::CPPTYPE_ENUM &&
          !IsEnumMapType(field)) {
        status = absl::FailedPreconditionError(
            absl::StrCat("Field ", field.full_name(),
                         " specifies the legacy_closed_enum feature but has "
                         "non-enum type."));
      }
    }

    if ((unresolved_features.string_type() == pb::CppFeatures::CORD ||
         field.legacy_proto_ctype() == FieldOptions::CORD) &&
        field.is_extension()) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Extension ", field.full_name(),
                       " specifies CORD string type which is not supported "
                       "for extensions."));
    }

    if ((unresolved_features.has_string_type() ||
         field.has_legacy_proto_ctype()) &&
        field.cpp_type() != FieldDescriptor::CPPTYPE_STRING) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies string_type, but is not a string nor bytes field."));
    }

    if (unresolved_features.has_string_type() &&
        field.has_legacy_proto_ctype()) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies both string_type and ctype which is not supported."));
    }
  });
  return status;
}